

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  uint uVar1;
  char *str;
  bool bVar2;
  size_t sVar3;
  GCstr *pGVar4;
  cTValue *pcVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint32_t *puVar13;
  char buf [32];
  uint local_84;
  TValue *local_68;
  char local_58 [40];
  
  uVar9 = -left;
  if (0 < left) {
    uVar9 = left;
  }
  uVar8 = (ulong)uVar9;
  do {
    pcVar5 = top + -1;
    if (*(uint *)((long)top + -4) == 0xfffffffb || *(uint *)((long)top + -4) < 0xffff0000) {
      if ((top->field_2).it != 0xfffffffb) {
        if (0xfffeffff < (top->field_2).it) goto LAB_0010cb00;
        sVar3 = lj_str_bufnum(local_58,top);
        pGVar4 = lj_str_new(L,local_58,sVar3);
        (top->u32).lo = (uint32_t)pGVar4;
        (top->field_2).it = 0xfffffffb;
      }
      uVar9 = *(uint *)((ulong)(top->u32).lo + 0xc);
      uVar7 = (uint)uVar8;
      if (uVar9 == 0) {
        local_84 = 1;
        if (*(uint *)((long)top + -4) < 0xffff0000) {
          puVar13 = (uint32_t *)((long)top + -4);
          sVar3 = lj_str_bufnum(local_58,pcVar5);
          pGVar4 = lj_str_new(L,local_58,sVar3);
          (pcVar5->u32).lo = (uint32_t)pGVar4;
          local_84 = 1;
          goto LAB_0010cc4c;
        }
      }
      else {
        if (uVar7 == 0) {
          local_84 = 0;
        }
        else {
          uVar10 = 0;
          do {
            if ((pcVar5->field_2).it != 0xfffffffb) {
              if (0xfffeffff < (pcVar5->field_2).it) {
                local_84 = (uint)uVar10;
                break;
              }
              sVar3 = lj_str_bufnum(local_58,pcVar5);
              pGVar4 = lj_str_new(L,local_58,sVar3);
              (pcVar5->u32).lo = (uint32_t)pGVar4;
              (pcVar5->field_2).it = 0xfffffffb;
            }
            uVar1 = *(uint *)((ulong)(pcVar5->u32).lo + 0xc);
            if (0x7fffff00 - uVar9 <= uVar1) {
              lj_err_msg(L,LJ_ERR_STROV);
            }
            uVar9 = uVar9 + uVar1;
            uVar10 = uVar10 + 1;
            pcVar5 = pcVar5 + -1;
            local_84 = uVar7;
          } while (uVar8 != uVar10);
        }
        uVar8 = (ulong)(L->glref).ptr32;
        if (*(uint *)(uVar8 + 100) < uVar9) {
          if (uVar9 < 0x21) {
            uVar9 = 0x20;
          }
          pvVar6 = lj_mem_realloc(L,*(void **)(uVar8 + 0x58),*(uint *)(uVar8 + 100),uVar9);
          *(void **)(uVar8 + 0x58) = pvVar6;
          *(uint *)(uVar8 + 100) = uVar9;
        }
        str = *(char **)(uVar8 + 0x58);
        pcVar5 = top + -(ulong)local_84;
        uVar9 = 0;
        lVar11 = (ulong)local_84 + 1;
        do {
          uVar1 = *(uint *)((ulong)(pcVar5->u32).lo + 0xc);
          memcpy(str + uVar9,(void *)((ulong)(pcVar5->u32).lo + 0x10),(ulong)uVar1);
          uVar9 = uVar9 + uVar1;
          pcVar5 = pcVar5 + 1;
          lVar12 = lVar11 + -1;
          bVar2 = 0 < lVar11;
          lVar11 = lVar12;
        } while (lVar12 != 0 && bVar2);
        pGVar4 = lj_str_new(L,str,(ulong)uVar9);
        top[-(long)(int)local_84].u32.lo = (uint32_t)pGVar4;
        puVar13 = &top[-(long)(int)local_84].field_2.it;
LAB_0010cc4c:
        *puVar13 = 0xfffffffb;
      }
      uVar8 = (ulong)(uVar7 - local_84);
      top = top + -(long)(int)local_84;
      bVar2 = true;
    }
    else {
LAB_0010cb00:
      pcVar5 = lj_meta_lookup(L,pcVar5,MM_concat);
      if (((pcVar5->field_2).it == 0xffffffff) &&
         (pcVar5 = lj_meta_lookup(L,top,MM_concat), (pcVar5->field_2).it == 0xffffffff)) {
        lj_err_optype(L,top + ((ulong)(*(uint *)((long)top + -4) < 0xffff0000 ||
                                      *(uint *)((long)top + -4) == 0xfffffffb) - 1),LJ_ERR_OPCAT);
      }
      local_68 = top + 1;
      top[1] = top[-1];
      top[2] = (cTValue)*(anon_struct_8_2_f9ee98fb_for_u32 *)top;
      *top = *pcVar5;
      top[-1].n = 3.50588982288949e-320;
      bVar2 = false;
    }
    if (!bVar2) {
      return local_68;
    }
    if ((int)uVar8 < 1) {
      uVar8 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar8 + 0x24) <= *(uint *)(uVar8 + 0x20)) {
        lj_meta_cat_cold_1();
      }
      return (TValue *)0x0;
    }
  } while( true );
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    int n = 1;
    if (!(tvisstr(top-1) || tvisnumber(top-1)) || !tostring(L, top)) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2, top);  /* Careful with the order of stack copies! */
      copyTV(L, top+1, top-1);
      copyTV(L, top, mo);
      setcont(top-1, lj_cont_cat);
      return top+1;  /* Trigger metamethod call. */
    } else if (strV(top)->len == 0) {  /* Shortcut. */
      (void)tostring(L, top-1);
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      MSize tlen = strV(top)->len;
      char *buffer;
      int i;
      for (n = 1; n <= left && tostring(L, top-n); n++) {
	MSize len = strV(top-n)->len;
	if (len >= LJ_MAX_STR - tlen)
	  lj_err_msg(L, LJ_ERR_STROV);
	tlen += len;
      }
      buffer = lj_str_needbuf(L, &G(L)->tmpbuf, tlen);
      n--;
      tlen = 0;
      for (i = n; i >= 0; i--) {
	MSize len = strV(top-i)->len;
	memcpy(buffer + tlen, strVdata(top-i), len);
	tlen += len;
      }
      setstrV(L, top-n, lj_str_new(L, buffer, tlen));
    }
    left -= n;
    top -= n;
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}